

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O2

void __thiscall SystemCatalog::listTypes(SystemCatalog *this,ostream *stream)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->types)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(stream,(string *)(p_Var2 + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void SystemCatalog::listTypes(ostream &stream) {

    for (const auto &type : this->types) {
        stream << type.typeName << endl;
    }
}